

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O3

RtAudioErrorType __thiscall RtApiAlsa::startStream(RtApiAlsa *this)

{
  ostringstream *poVar1;
  StreamMutex *__mutex;
  StreamState SVar2;
  undefined8 *puVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  ostream *poVar8;
  char *pcVar9;
  RtAudioErrorType type;
  RtAudioErrorType RVar10;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  SVar2 = (this->super_RtApi).stream_.state;
  if (SVar2 < STREAM_STOPPING) {
    if (SVar2 == STREAM_CLOSED) {
LAB_0010e3f1:
      pcVar7 = (char *)(this->super_RtApi).errorText_._M_string_length;
      pcVar9 = "RtApiAlsa::startStream(): the stream is stopping or closed!";
      goto LAB_0010e40c;
    }
    if (SVar2 == STREAM_STOPPED) {
      __mutex = &(this->super_RtApi).stream_.mutex;
      pthread_mutex_lock((pthread_mutex_t *)__mutex);
      puVar3 = (undefined8 *)(this->super_RtApi).stream_.apiHandle;
      iVar5 = 0;
      if (((((this->super_RtApi).stream_.mode & ~DUPLEX) == OUTPUT) &&
          (iVar4 = snd_pcm_state(*puVar3), iVar4 != 2)) &&
         (iVar5 = snd_pcm_prepare(*puVar3), iVar5 < 0)) {
        poVar8 = (ostream *)&(this->super_RtApi).errorStream_;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"RtApiAlsa::startStream: error preparing output pcm device, ",0x3b);
        pcVar7 = (char *)snd_strerror(iVar5);
        if (pcVar7 == (char *)0x0) {
          std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
        }
        else {
          sVar6 = strlen(pcVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar7,sVar6);
        }
LAB_0010e4da:
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,".",1);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=
                  ((string *)&(this->super_RtApi).errorText_,(string *)local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        *(undefined1 *)(puVar3 + 9) = 1;
        pthread_cond_signal((pthread_cond_t *)(puVar3 + 3));
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      }
      else {
        if (((uint)((this->super_RtApi).stream_.mode + ~OUTPUT) < 2) &&
           (*(char *)(puVar3 + 2) == '\0')) {
          iVar5 = snd_pcm_drop(puVar3[1]);
          iVar4 = snd_pcm_state(puVar3[1]);
          if ((iVar4 != 2) && (iVar5 = snd_pcm_prepare(puVar3[1]), iVar5 < 0)) {
            poVar1 = &(this->super_RtApi).errorStream_;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,
                       "RtApiAlsa::startStream: error preparing input pcm device, ",0x3a);
            pcVar7 = (char *)snd_strerror(iVar5);
            poVar8 = std::operator<<((ostream *)poVar1,pcVar7);
            goto LAB_0010e4da;
          }
        }
        (this->super_RtApi).stream_.state = STREAM_RUNNING;
        *(undefined1 *)(puVar3 + 9) = 1;
        pthread_cond_signal((pthread_cond_t *)(puVar3 + 3));
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        if (-1 < iVar5) {
          return RTAUDIO_NO_ERROR;
        }
      }
      RVar10 = RTAUDIO_SYSTEM_ERROR;
      type = RTAUDIO_SYSTEM_ERROR;
      goto LAB_0010e421;
    }
  }
  else {
    if (SVar2 == STREAM_STOPPING) goto LAB_0010e3f1;
    if (SVar2 != STREAM_RUNNING) goto LAB_0010e413;
    pcVar7 = (char *)(this->super_RtApi).errorText_._M_string_length;
    pcVar9 = "RtApiAlsa::startStream(): the stream is already running!";
LAB_0010e40c:
    std::__cxx11::string::_M_replace((ulong)&(this->super_RtApi).errorText_,0,pcVar7,(ulong)pcVar9);
  }
LAB_0010e413:
  RVar10 = RTAUDIO_WARNING;
  type = RTAUDIO_WARNING;
LAB_0010e421:
  RtApi::error(&this->super_RtApi,type);
  return RVar10;
}

Assistant:

RtAudioErrorType RtApiAlsa :: startStream()
{
  // This method calls snd_pcm_prepare if the device isn't already in that state.

  if ( stream_.state != STREAM_STOPPED ) {
    if ( stream_.state == STREAM_RUNNING )
      errorText_ = "RtApiAlsa::startStream(): the stream is already running!";
    else if ( stream_.state == STREAM_STOPPING || stream_.state == STREAM_CLOSED )
      errorText_ = "RtApiAlsa::startStream(): the stream is stopping or closed!";
    return error( RTAUDIO_WARNING );
  }

  MUTEX_LOCK( &stream_.mutex );

  /*
  #if defined( HAVE_GETTIMEOFDAY )
  gettimeofday( &stream_.lastTickTimestamp, NULL );
  #endif
  */
  
  int result = 0;
  snd_pcm_state_t state;
  AlsaHandle *apiInfo = (AlsaHandle *) stream_.apiHandle;
  snd_pcm_t **handle = (snd_pcm_t **) apiInfo->handles;
  if ( stream_.mode == OUTPUT || stream_.mode == DUPLEX ) {
    state = snd_pcm_state( handle[0] );
    if ( state != SND_PCM_STATE_PREPARED ) {
      result = snd_pcm_prepare( handle[0] );
      if ( result < 0 ) {
        errorStream_ << "RtApiAlsa::startStream: error preparing output pcm device, " << snd_strerror( result ) << ".";
        errorText_ = errorStream_.str();
        goto unlock;
      }
    }
  }

  if ( ( stream_.mode == INPUT || stream_.mode == DUPLEX ) && !apiInfo->synchronized ) {
    result = snd_pcm_drop(handle[1]); // fix to remove stale data received since device has been open
    state = snd_pcm_state( handle[1] );
    if ( state != SND_PCM_STATE_PREPARED ) {
      result = snd_pcm_prepare( handle[1] );
      if ( result < 0 ) {
        errorStream_ << "RtApiAlsa::startStream: error preparing input pcm device, " << snd_strerror( result ) << ".";
        errorText_ = errorStream_.str();
        goto unlock;
      }
    }
  }

  stream_.state = STREAM_RUNNING;

 unlock:
  apiInfo->runnable = true;
  pthread_cond_signal( &apiInfo->runnable_cv );
  MUTEX_UNLOCK( &stream_.mutex );

  if ( result < 0 ) return error( RTAUDIO_SYSTEM_ERROR );
  return RTAUDIO_NO_ERROR;
}